

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NTSCD.h
# Opt level: O3

void __thiscall dg::llvmdg::legacy::NTSCD::compute(NTSCD *this,Function *F)

{
  char cVar1;
  Module *pMVar2;
  Module *F_00;
  Module *pMVar3;
  pair<std::_Rb_tree_iterator<const_llvm::Function_*>,_bool> pVar4;
  Function *local_40;
  Function *local_38;
  
  local_40 = F;
  if (((F != (Function *)0x0) && (cVar1 = llvm::GlobalValue::isDeclaration(), cVar1 == '\0')) &&
     (pVar4 = std::
              _Rb_tree<llvm::Function_const*,llvm::Function_const*,std::_Identity<llvm::Function_const*>,std::less<llvm::Function_const*>,std::allocator<llvm::Function_const*>>
              ::_M_insert_unique<llvm::Function_const*const&>
                        ((_Rb_tree<llvm::Function_const*,llvm::Function_const*,std::_Identity<llvm::Function_const*>,std::less<llvm::Function_const*>,std::allocator<llvm::Function_const*>>
                          *)&this->_computed,&local_40),
     ((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    computeOnDemand(this,local_40);
    return;
  }
  pMVar3 = (this->super_LLVMControlDependenceAnalysisImpl)._module;
  pMVar2 = *(Module **)(pMVar3 + 0x20);
  pMVar3 = pMVar3 + 0x18;
  if (pMVar2 != pMVar3) {
    do {
      F_00 = pMVar2 + -0x38;
      if (pMVar2 == (Module *)0x0) {
        F_00 = (Module *)0x0;
      }
      cVar1 = llvm::GlobalValue::isDeclaration();
      if ((cVar1 == '\0') &&
         (local_38 = (Function *)F_00,
         pVar4 = std::
                 _Rb_tree<llvm::Function_const*,llvm::Function_const*,std::_Identity<llvm::Function_const*>,std::less<llvm::Function_const*>,std::allocator<llvm::Function_const*>>
                 ::_M_insert_unique<llvm::Function_const*>
                           ((_Rb_tree<llvm::Function_const*,llvm::Function_const*,std::_Identity<llvm::Function_const*>,std::less<llvm::Function_const*>,std::allocator<llvm::Function_const*>>
                             *)&this->_computed,&local_38),
         ((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
        computeOnDemand(this,(Function *)F_00);
      }
      pMVar2 = *(Module **)(pMVar2 + 8);
    } while (pMVar2 != pMVar3);
  }
  return;
}

Assistant:

void compute(const llvm::Function *F = nullptr) override {
        DBG(cda, "Triggering computation of all dependencies");
        if (F && !F->isDeclaration() && _computed.insert(F).second) {
            computeOnDemand(const_cast<llvm::Function *>(F));
        } else {
            for (const auto &f : *getModule()) {
                if (!f.isDeclaration() && _computed.insert(&f).second) {
                    computeOnDemand(const_cast<llvm::Function *>(&f));
                }
            }
        }
    }